

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

void __thiscall
perfetto::protos::gen::TracingServiceState_DataSource::TracingServiceState_DataSource
          (TracingServiceState_DataSource *this,TracingServiceState_DataSource *param_1)

{
  pointer pcVar1;
  pointer *__ptr;
  
  (this->super_CppMessageObj)._vptr_CppMessageObj =
       (_func_int **)&PTR__TracingServiceState_DataSource_003c7238;
  protozero::CopyablePtr<perfetto::protos::gen::DataSourceDescriptor>::CopyablePtr
            (&this->ds_descriptor_,&param_1->ds_descriptor_);
  this->producer_id_ = param_1->producer_id_;
  (this->unknown_fields_)._M_dataplus._M_p = (pointer)&(this->unknown_fields_).field_2;
  pcVar1 = (param_1->unknown_fields_)._M_dataplus._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->unknown_fields_,pcVar1,
             pcVar1 + (param_1->unknown_fields_)._M_string_length);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

TracingServiceState_DataSource::TracingServiceState_DataSource(const TracingServiceState_DataSource&) = default;